

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

cmRulePlaceholderExpander * __thiscall
cmLocalGenerator::CreateRulePlaceholderExpander(cmLocalGenerator *this)

{
  cmRulePlaceholderExpander *this_00;
  
  this_00 = (cmRulePlaceholderExpander *)operator_new(0xc0);
  cmRulePlaceholderExpander::cmRulePlaceholderExpander
            (this_00,&this->Compilers,&this->VariableMappings,&this->CompilerSysroot,
             &this->LinkerSysroot);
  return this_00;
}

Assistant:

cmRulePlaceholderExpander* cmLocalGenerator::CreateRulePlaceholderExpander()
  const
{
  return new cmRulePlaceholderExpander(this->Compilers, this->VariableMappings,
                                       this->CompilerSysroot,
                                       this->LinkerSysroot);
}